

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall
TPZVec<TPZGeoElSidePartition>::TPZVec
          (TPZVec<TPZGeoElSidePartition> *this,TPZVec<TPZGeoElSidePartition> *copy)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  TPZGeoElSidePartition *pTVar6;
  long lVar7;
  int64_t i;
  long lVar8;
  ulong uVar9;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_0172e6d0;
  this->fStore = (TPZGeoElSidePartition *)0x0;
  uVar9 = copy->fNElements;
  if ((long)uVar9 < 1) {
    pTVar6 = (TPZGeoElSidePartition *)0x0;
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar9;
    uVar3 = SUB168(auVar2 * ZEXT816(0x38),0);
    uVar4 = uVar3 + 8;
    if (0xfffffffffffffff7 < uVar3) {
      uVar4 = 0xffffffffffffffff;
    }
    uVar3 = 0xffffffffffffffff;
    if (SUB168(auVar2 * ZEXT816(0x38),8) == 0) {
      uVar3 = uVar4;
    }
    puVar5 = (ulong *)operator_new__(uVar3);
    *puVar5 = uVar9;
    pTVar6 = (TPZGeoElSidePartition *)(puVar5 + 1);
    lVar7 = 0;
    do {
      *(undefined ***)((long)puVar5 + lVar7 + 8) = &PTR__TPZGeoElSide_0172da80;
      *(undefined8 *)((long)puVar5 + lVar7 + 0x10) = 0;
      *(undefined4 *)((long)puVar5 + lVar7 + 0x18) = 0xffffffff;
      *(undefined ***)((long)puVar5 + lVar7 + 0x20) = &PTR__TPZVec_0172e6d0;
      *(undefined8 *)((long)puVar5 + lVar7 + 0x38) = 0;
      puVar1 = (undefined8 *)((long)puVar5 + lVar7 + 0x28);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar7 = lVar7 + 0x38;
    } while (uVar9 * 0x38 - lVar7 != 0);
  }
  this->fStore = pTVar6;
  lVar7 = 0;
  for (lVar8 = 0; lVar8 < (long)uVar9; lVar8 = lVar8 + 1) {
    TPZGeoElSidePartition::operator=
              ((TPZGeoElSidePartition *)
               ((long)&(this->fStore->fCurrent).super_TPZSavable._vptr_TPZSavable + lVar7),
               (TPZGeoElSidePartition *)
               ((long)&(copy->fStore->fCurrent).super_TPZSavable._vptr_TPZSavable + lVar7));
    uVar9 = copy->fNElements;
    lVar7 = lVar7 + 0x38;
  }
  this->fNElements = uVar9;
  this->fNAlloc = copy->fNAlloc;
  return;
}

Assistant:

TPZVec<T>::TPZVec(const TPZVec<T> &copy){
	fStore = nullptr;
	
	if( copy.fNElements > 0 )
		fStore = new T[copy.fNElements];
	else
		fStore = nullptr;
	
	for(int64_t i=0; i<copy.fNElements; i++)
		fStore[i]=copy.fStore[i];
	
	fNElements = copy.fNElements;
    fNAlloc = copy.fNAlloc;
}